

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Complete_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Repair_Complete_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Repair_Complete_PDU *this)

{
  ostream *poVar1;
  ostream *poVar2;
  KINT32 Value;
  char cVar3;
  ulong uVar4;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar1 = std::operator<<(local_1a8,(string *)&local_360);
  poVar2 = std::operator<<(poVar1,"-Repair Complete PDU-\n");
  Logistics_Header::GetAsString_abi_cxx11_(&local_3a0,&this->super_Logistics_Header);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar1,'\t');
  uVar4 = 0;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    if (local_3a0._M_string_length <= uVar4) break;
    cVar3 = local_3a0._M_dataplus._M_p[uVar4];
    if (local_3a0._M_string_length - 1 != uVar4 && cVar3 == '\n') {
      cVar3 = '\t';
      std::operator<<(poVar1,'\n');
    }
    std::operator<<(poVar1,cVar3);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar1 = std::operator<<(poVar2,local_380);
  poVar1 = std::operator<<(poVar1,"\tRepair Performed:      ");
  DATA_TYPE::ENUMS::GetEnumAsStringRepairTypePerformed_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui16Repair,Value);
  poVar1 = std::operator<<(poVar1,(string *)local_340);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Repair_Complete_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Repair Complete PDU-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 )
       << "\tRepair Performed:      " << GetEnumAsStringRepairTypePerformed( m_ui16Repair )
       << "\n";

    return ss.str();
}